

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall lunasvg::SVGRect::parse(SVGRect *this,string_view input)

{
  bool bVar1;
  Rect value;
  string_view local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_38._M_str = input._M_str;
  local_38._M_len = input._M_len;
  local_28 = 0;
  uStack_20 = 0;
  stripLeadingAndTrailingSpaces(&local_38);
  bVar1 = parseNumber<float>(&local_38,(float *)&local_28);
  if ((((!bVar1) || (bVar1 = skipOptionalSpacesOrComma(&local_38), !bVar1)) ||
      (bVar1 = parseNumber<float>(&local_38,(float *)((long)&local_28 + 4)), !bVar1)) ||
     (((bVar1 = skipOptionalSpacesOrComma(&local_38), !bVar1 ||
       (bVar1 = parseNumber<float>(&local_38,(float *)&uStack_20), !bVar1)) ||
      (bVar1 = skipOptionalSpacesOrComma(&local_38), !bVar1)))) {
    return false;
  }
  bVar1 = parseNumber<float>(&local_38,(float *)((long)&uStack_20 + 4));
  if (!bVar1) {
    return false;
  }
  if (local_38._M_len != 0) {
    return false;
  }
  if ((float)uStack_20 < 0.0) {
    return false;
  }
  if (uStack_20._4_4_ < 0.0) {
    return false;
  }
  *(undefined8 *)&(this->super_SVGProperty).field_0xc = local_28;
  *(undefined8 *)&this->field_0x14 = uStack_20;
  return true;
}

Assistant:

bool SVGRect::parse(std::string_view input)
{
    Rect value;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value.x)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.y)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.w)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.h)
        || !input.empty()) {
        return false;
    }

    if(value.w < 0.f || value.h < 0.f)
        return false;
    m_value = value;
    return true;
}